

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *hs,uint16_t *out_group_id)

{
  uint16_t uVar1;
  SSL *ssl;
  uint16_t uVar2;
  size_t sVar3;
  uint16_t *puVar4;
  size_t sVar5;
  uint16_t *puVar6;
  long lVar7;
  uint16_t *puVar8;
  uint16_t *local_48;
  
  ssl = hs->ssl;
  if ((ssl->field_0xa4 & 1) == 0) {
    __assert_fail("ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xd9,"bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *, uint16_t *)");
  }
  sVar3 = (hs->config->supported_group_list).size_;
  if (sVar3 == 0) {
    puVar4 = &kDefaultGroups;
    sVar3 = 3;
  }
  else {
    puVar4 = (hs->config->supported_group_list).data_;
  }
  puVar8 = (hs->peer_supported_group_list).data_;
  sVar5 = (hs->peer_supported_group_list).size_;
  if ((ssl->options & 0x400000) == 0) {
    if (sVar5 == 0) {
      return false;
    }
    local_48 = puVar8 + sVar5;
    sVar5 = sVar3;
    puVar6 = puVar8;
    puVar8 = puVar4;
  }
  else {
    local_48 = puVar4 + sVar3;
    puVar6 = puVar4;
  }
  do {
    if (sVar5 != 0) {
      uVar1 = *puVar6;
      lVar7 = 0;
      do {
        if ((uVar1 == *(uint16_t *)((long)puVar8 + lVar7)) &&
           ((uVar2 = ssl_protocol_version(ssl), 0x303 < uVar2 ||
            ((uVar1 != 0x11ec && (uVar1 != 0x6399)))))) {
          *out_group_id = uVar1;
          return true;
        }
        lVar7 = lVar7 + 2;
      } while (sVar5 * 2 != lVar7);
    }
    puVar6 = puVar6 + 1;
    if (puVar6 == local_48) {
      return false;
    }
  } while( true );
}

Assistant:

bool tls1_get_shared_group(SSL_HANDSHAKE *hs, uint16_t *out_group_id) {
  SSL *const ssl = hs->ssl;
  assert(ssl->server);

  // Clients are not required to send a supported_groups extension. In this
  // case, the server is free to pick any group it likes. See RFC 4492,
  // section 4, paragraph 3.
  //
  // However, in the interests of compatibility, we will skip ECDH if the
  // client didn't send an extension because we can't be sure that they'll
  // support our favoured group. Thus we do not special-case an emtpy
  // |peer_supported_group_list|.

  Span<const uint16_t> groups = tls1_get_grouplist(hs);
  Span<const uint16_t> pref, supp;
  if (ssl->options & SSL_OP_CIPHER_SERVER_PREFERENCE) {
    pref = groups;
    supp = hs->peer_supported_group_list;
  } else {
    pref = hs->peer_supported_group_list;
    supp = groups;
  }

  for (uint16_t pref_group : pref) {
    for (uint16_t supp_group : supp) {
      if (pref_group == supp_group &&
          // Post-quantum key agreements don't fit in the u8-length-prefixed
          // ECPoint field in TLS 1.2 and below.
          (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||
           !is_post_quantum_group(pref_group))) {
        *out_group_id = pref_group;
        return true;
      }
    }
  }

  return false;
}